

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O0

void intgemm::anon_unknown_0::TestMultiplyShiftInt<intgemm::AVX512VNNI::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  anon_class_16_2_71e48296 callback_01;
  anon_class_16_2_f8caf180 callback_02;
  float unquant_mult_00;
  ostream *poVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  char *pcVar5;
  uchar *B_00;
  uchar *A_00;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  result_type_conflict rVar6;
  float unquant_mult_01;
  float unquant_mult_forprep;
  AlignedVector<float> ShiftedBias;
  char *it_3;
  char *__end2_3;
  char *__begin2_3;
  AlignedVector<signed_char> *__range2_3;
  AlignedVector<signed_char> A_prep2;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> B_quant;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<signed_char> A_prep_old;
  AlignedVector<unsigned_char> A_prep;
  float unquant_mult;
  float quant_mult;
  float alpha;
  float *it_2;
  float *__end2_2;
  float *__begin2_2;
  AlignedVector<float> *__range2_2;
  float *it_1;
  float *__end2_1;
  float *__begin2_1;
  AlignedVector<float> *__range2_1;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  ostringstream info;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe7b8;
  Index cols;
  Index in_stack_ffffffffffffe7c0;
  float in_stack_ffffffffffffe7c4;
  uint8_t *in_stack_ffffffffffffe7c8;
  AlignedVector<float> *in_stack_ffffffffffffe7d0;
  undefined8 in_stack_ffffffffffffe7e0;
  Index B_cols_00;
  AlignedVector<float> *pAVar7;
  undefined8 in_stack_ffffffffffffe7e8;
  float *in_stack_ffffffffffffe7f0;
  float *in_stack_ffffffffffffe7f8;
  float *in_stack_ffffffffffffe800;
  float *in_stack_ffffffffffffe808;
  anon_class_8_1_8989cfb7 in_stack_ffffffffffffe810;
  undefined4 in_stack_ffffffffffffe818;
  undefined4 in_stack_ffffffffffffe81c;
  string local_1708 [32];
  undefined1 *local_16e8;
  AlignedVector<float> *pAStack_16e0;
  UnquantizeAndAddBiasAndWrite local_16d8;
  UnquantizeAndAddBiasAndWrite local_16c0;
  float *local_16a8;
  AlignedVector<float> *pAStack_16a0;
  float local_1694;
  AlignedVector<float> local_1690;
  char *local_1680;
  char *local_1678;
  char *local_1670;
  AlignedVector<signed_char> *local_1668;
  AlignedVector<signed_char> local_1660;
  AlignedVector<float> *local_1650;
  AlignedVector<float> local_1648;
  AlignedVector<float> local_1638;
  AlignedVector<signed_char> local_1628;
  AlignedVector<float> local_1618;
  AlignedVector<signed_char> local_1608;
  AlignedVector<signed_char> local_15f8;
  Index in_stack_ffffffffffffea18;
  float in_stack_ffffffffffffea1c;
  int8_t *in_stack_ffffffffffffea20;
  undefined4 in_stack_ffffffffffffea28;
  float *local_15b8;
  float *local_1598;
  Index cols_00;
  float *in_stack_ffffffffffffea98;
  float in_stack_ffffffffffffefa0;
  float in_stack_ffffffffffffefa4;
  float in_stack_ffffffffffffefa8;
  float in_stack_ffffffffffffefac;
  string *in_stack_ffffffffffffefb0;
  size_t in_stack_ffffffffffffefb8;
  float *in_stack_ffffffffffffefc0;
  float *in_stack_ffffffffffffefc8;
  float *in_stack_ffffffffffffefd0;
  Index in_stack_fffffffffffff390;
  Index in_stack_fffffffffffff394;
  int8_t *in_stack_fffffffffffff398;
  Index in_stack_fffffffffffff3c4;
  Index in_stack_fffffffffffff3c8;
  Index in_stack_fffffffffffff3cc;
  int8_t *in_stack_fffffffffffff3d0;
  uint8_t *in_stack_fffffffffffff3d8;
  AlignedVector<float> local_1d8;
  AlignedVector<float> local_1c8;
  AlignedVector<float> local_1b8 [2];
  ostringstream local_198 [396];
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"8-bit AVX512VNNI");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,'\n');
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x1eed0f);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
             (float)((ulong)in_stack_ffffffffffffe7b8 >> 0x20),SUB84(in_stack_ffffffffffffe7b8,0));
  pAVar7 = local_1b8;
  pfVar2 = AlignedVector<float>::begin(pAVar7);
  pfVar3 = AlignedVector<float>::end(pAVar7);
  while (pfVar2 != pfVar3) {
    pfVar4 = pfVar2;
    rVar6 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                       in_stack_ffffffffffffe7b8);
    *pfVar2 = rVar6;
    pfVar2 = pfVar4 + 1;
  }
  local_1598 = AlignedVector<float>::begin(&local_1c8);
  pfVar4 = AlignedVector<float>::end(&local_1c8);
  for (; cols_00 = (Index)((ulong)pfVar3 >> 0x20),
      B_cols_00 = (Index)((ulong)in_stack_ffffffffffffe7e0 >> 0x20), local_1598 != pfVar4;
      local_1598 = local_1598 + 1) {
    rVar6 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                       in_stack_ffffffffffffe7b8);
    *local_1598 = rVar6;
  }
  local_15b8 = AlignedVector<float>::begin(&local_1d8);
  cols = (Index)((ulong)in_stack_ffffffffffffe7b8 >> 0x20);
  pfVar3 = AlignedVector<float>::end(&local_1d8);
  for (; local_15b8 != pfVar3; local_15b8 = local_15b8 + 1) {
    *local_15b8 = 0.0;
  }
  unquant_mult_01 = 0.0002480005;
  AlignedVector<float>::size(local_1b8);
  AlignedVector<unsigned_char>::AlignedVector
            ((AlignedVector<unsigned_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::size(local_1b8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<unsigned_char>::begin((AlignedVector<unsigned_char> *)&stack0xffffffffffffea18);
  AVX512BW::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7c4,
             in_stack_ffffffffffffe7c0,cols);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<signed_char>::begin(&local_15f8);
  AVX512BW::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe7d0,(int8_t *)in_stack_ffffffffffffe7c8,
             in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0,cols);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin(&local_1608);
  AVX512BW::Kernels8::PrepareB
            (in_stack_ffffffffffffea98,(int8_t *)pAVar7,(float)((ulong)pfVar2 >> 0x20),(Index)pfVar2
             ,cols_00);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin(&local_1628);
  AlignedVector<float>::size(&local_1c8);
  AVX512BW::Kernels8::Quantize
            ((float *)CONCAT44(unquant_mult_01,in_stack_ffffffffffffea28),in_stack_ffffffffffffea20,
             in_stack_ffffffffffffea1c,in_stack_ffffffffffffea18);
  AlignedVector<float>::size(&local_1618);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::size(&local_1618);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<float>::begin(&local_1648);
  local_1650 = &local_1d8;
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:249:86),_nullptr>
            (in_stack_ffffffffffffe808,in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8,
             (Index)((ulong)in_stack_ffffffffffffe7f0 >> 0x20),(Index)in_stack_ffffffffffffe7f0,
             (Index)((ulong)in_stack_ffffffffffffe7e8 >> 0x20),in_stack_ffffffffffffe810);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe7d0,
             (size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  local_1668 = &local_1660;
  local_1670 = AlignedVector<signed_char>::begin(local_1668);
  local_1678 = AlignedVector<signed_char>::end(local_1668);
  for (; local_1670 != local_1678; local_1670 = local_1670 + 1) {
    local_1680 = local_1670;
    *local_1670 = '\x01';
  }
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe7d0,(size_t)in_stack_ffffffffffffe7c8,
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0));
  local_1694 = -0.031496063;
  AlignedVector<signed_char>::begin(&local_1660);
  AlignedVector<signed_char>::begin(&local_1628);
  AlignedVector<float>::begin(&local_1690);
  local_16a8 = &local_1694;
  pAStack_16a0 = &local_1d8;
  callback_01.bias._0_4_ = in_stack_ffffffffffffe818;
  callback_01.unquant_mult_forprep = (float *)in_stack_ffffffffffffe810.bias;
  callback_01.bias._4_4_ = in_stack_ffffffffffffe81c;
  references::
  Multiply<signed_char,_signed_char,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:262:97),_nullptr>
            ((char *)in_stack_ffffffffffffe800,(char *)in_stack_ffffffffffffe7f8,
             in_stack_ffffffffffffe7f0,(Index)((ulong)in_stack_ffffffffffffe7e8 >> 0x20),
             (Index)in_stack_ffffffffffffe7e8,B_cols_00,callback_01);
  AlignedVector<signed_char>::begin(&local_1608);
  unquant_mult_00 = local_1694;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1d8);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_16c0,unquant_mult_00,pfVar2,pfVar3);
  callback.bias_addr = local_16c0.output_addr;
  callback._0_8_ = local_16c0.bias_addr;
  callback.output_addr = (float *)in_stack_ffffffffffffe7d0;
  AVX512VNNI::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_fffffffffffff398,in_stack_fffffffffffff394,in_stack_fffffffffffff390,callback)
  ;
  AlignedVector<unsigned_char>::begin((AlignedVector<unsigned_char> *)&stack0xffffffffffffea18);
  pcVar5 = AlignedVector<signed_char>::begin(&local_1608);
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1618);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_16d8,unquant_mult_01,pfVar2,pfVar3);
  callback_00.bias_addr = local_16d8.output_addr;
  callback_00._0_8_ = local_16d8.bias_addr;
  callback_00.output_addr = (float *)in_stack_ffffffffffffe7d0;
  AVX512VNNI::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,in_stack_fffffffffffff3cc,
             in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c4,callback_00);
  B_00 = AlignedVector<unsigned_char>::begin
                   ((AlignedVector<unsigned_char> *)&stack0xffffffffffffea18);
  A_00 = (uchar *)AlignedVector<signed_char>::begin(&local_1628);
  AlignedVector<float>::begin(&local_1638);
  local_16e8 = &stack0xffffffffffffea2c;
  pAStack_16e0 = &local_1690;
  callback_02.ShiftedBias._0_4_ = local_4;
  callback_02.unquant_mult = (float *)pcVar5;
  callback_02.ShiftedBias._4_4_ = local_8;
  references::
  Multiply<unsigned_char,_signed_char,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:273:99),_nullptr>
            (A_00,(char *)B_00,in_stack_ffffffffffffe7f0,
             (Index)((ulong)in_stack_ffffffffffffe7e8 >> 0x20),(Index)in_stack_ffffffffffffe7e8,
             B_cols_00,callback_02);
  AlignedVector<float>::begin(&local_1648);
  AlignedVector<float>::begin(&local_1638);
  pAVar7 = &local_1618;
  AlignedVector<float>::begin(pAVar7);
  AlignedVector<float>::size(pAVar7);
  std::__cxx11::ostringstream::str();
  CompareMSE(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,
             in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,in_stack_ffffffffffffefac,
             in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_1708);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ef78e);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1ef79b);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ef7a8);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ef7b5);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1ef7c2);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ef7cf);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1ef7dc);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1ef7e9);
  AlignedVector<unsigned_char>::~AlignedVector((AlignedVector<unsigned_char> *)0x1ef7f6);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ef803);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ef810);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1ef81d);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void TestMultiplyShiftInt(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = 0;
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> A_prep_old(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareA(A.begin(), A_prep_old.begin(), quant_mult, A_rows, width); //Non shited version
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*
   * Reference float multiplication
   */
  AlignedVector<int8_t> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Taking the original A_preparation which means A would be int8_t
  // references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
  //   return sum * unquant_mult + bias[info.col_idx];
  // });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });
  /*
   * Multiply8 shift multiplication
   */
  //First prepare SlowInteger Bias:
  AlignedVector<int8_t> A_prep2(1*width);
  for (auto& it : A_prep2) {
    it = 1;
  }
  AlignedVector<float> ShiftedBias(B_cols);
  float unquant_mult_forprep = (-1)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  references::Multiply(A_prep2.begin(), B_quant.begin(), ShiftedBias.begin(), 1, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult_forprep + bias[info.col_idx];
  });
  

  //Now prepare Fast integer Bias
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  // Reference INT VERSION HERE with ADD127
  // Taking the original A_preparation which means A would be int8_t
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult + ShiftedBias[info.col_idx];
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}